

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O3

void __thiscall
chrono::ChArchiveAsciiDump::out_ref
          (ChArchiveAsciiDump *this,ChValue *bVal,bool already_inserted,size_t obj_ID,size_t ext_ID)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  ChStreamOutAscii *pCVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  
  iVar3 = (*bVal->_vptr_ChValue[3])(bVal);
  pcVar5 = *(char **)CONCAT44(extraout_var,iVar3);
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar3 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  if (this->suppress_names == false) {
    chrono::ChStreamOutAscii::operator<<(this->ostream,(bVal->_name)._M_dataplus._M_p);
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"->");
  cVar2 = *pcVar5;
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream," [");
  if (cVar2 == '\0') {
    iVar3 = (*bVal->_vptr_ChValue[5])(bVal);
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar4,(char *)CONCAT44(extraout_var_00,iVar3));
    pcVar5 = "]";
  }
  else {
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,pcVar5);
    pcVar5 = "] (registered type)";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar4,pcVar5);
  if (obj_ID != 0) {
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,"  ID=");
    chrono::ChStreamOutAscii::operator<<(pCVar4,obj_ID);
  }
  if (ext_ID != 0) {
    pCVar4 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(this->ostream,"  external_ID=");
    chrono::ChStreamOutAscii::operator<<(pCVar4,ext_ID);
  }
  if ((this->super_ChArchiveOut).super_ChArchive.use_versions == true) {
    pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream," version=");
    iVar3 = (*bVal->_vptr_ChValue[4])(bVal);
    chrono::ChStreamOutAscii::operator<<(pCVar4,iVar3);
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\n");
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  if (!already_inserted) {
    iVar3 = (*bVal->_vptr_ChValue[7])(bVal);
    if ((char)iVar3 == '\0') {
      (*bVal->_vptr_ChValue[0xd])(bVal,this);
    }
    else {
      chrono::ChStreamOutAscii::operator<<(this->ostream,"NULL\n");
    }
  }
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  return;
}

Assistant:

virtual void out_ref          (ChValue& bVal,  bool already_inserted, size_t obj_ID, size_t ext_ID) 
      {
          const char* classname = bVal.GetClassRegisteredName().c_str();
          indent();
          if (!suppress_names) 
                (*ostream) << bVal.name(); 
          (*ostream) << "->";
          if(strlen(classname)>0) {
                (*ostream) << " [" << classname << "] (registered type)";
          } else {
                (*ostream) << " [" << bVal.GetTypeidName() << "]";
          }
          if (obj_ID)
            (*ostream) << "  ID=" << obj_ID;
          if (ext_ID)
            (*ostream) << "  external_ID=" << ext_ID;
          if (this->use_versions)
            (*ostream) << " version=" << bVal.GetClassRegisteredVersion();
          (*ostream) << "\n";
          ++tablevel;
          if (!already_inserted) {
             if (!bVal.IsNull()) {
                    // New Object, we have to full serialize it
                    bVal.CallArchiveOut(*this);
              } else {
                  (*ostream) << "NULL\n";
              }
          } 
          --tablevel;
      }